

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O0

void __thiscall miniros::MasterLink::setRetryTimeout(MasterLink *this,WallDuration *timeout)

{
  bool bVar1;
  DurationBase<miniros::WallDuration> *in_RSI;
  string *in_RDI;
  bool enabled;
  undefined8 in_stack_ffffffffffffff78;
  Level level;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  double in_stack_ffffffffffffff88;
  LogLocation *loc;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  allocator<char> in_stack_ffffffffffffffb7;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  LogLocation local_18;
  
  level = (Level)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  if (*(long *)in_RDI != 0) {
    loc = &local_18;
    WallDuration::WallDuration((WallDuration *)loc,in_stack_ffffffffffffff88);
    bVar1 = DurationBase<miniros::WallDuration>::operator<(in_RSI,(WallDuration *)loc);
    WallDuration::~WallDuration((WallDuration *)0x457e92);
    if (bVar1) {
      if (((CONCAT71(0x6410,console::g_initialized) ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((setRetryTimeout::loc.initialized_ ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                   (allocator<char> *)
                   CONCAT17(in_stack_ffffffffffffffb7,
                            CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)));
        console::initializeLogLocation
                  ((LogLocation *)
                   CONCAT17(in_stack_ffffffffffffffb7,
                            CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),in_RDI,
                   (Level)((ulong)in_RSI >> 0x20));
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
      }
      if (setRetryTimeout::loc.level_ != Fatal) {
        console::setLogLocationLevel
                  ((LogLocation *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                   level);
        console::checkLogLocationEnabled(loc);
      }
      if ((setRetryTimeout::loc.logger_enabled_ & 1U) != 0) {
        console::print((FilterBase *)0x0,setRetryTimeout::loc.logger_,
                       (Level)(ulong)setRetryTimeout::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                       ,0x86,"void miniros::MasterLink::setRetryTimeout(miniros::WallDuration)",
                       "retry timeout must not be negative.");
      }
    }
    *(DurationBase<miniros::WallDuration> *)(*(long *)in_RDI + 0x58) = *in_RSI;
  }
  return;
}

Assistant:

void MasterLink::setRetryTimeout(miniros::WallDuration timeout)
{
  if (!internal_)
    return;
  if (timeout < miniros::WallDuration(0)) {
    MINIROS_FATAL("retry timeout must not be negative.");
    MINIROS_BREAK();
  }
  internal_->retry_timeout = timeout;
}